

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

Charmap * charmap_New(char *name,char *baseName)

{
  char *pcVar1;
  Charmap *local_30;
  Charmap *charmap;
  Charmap *base;
  char *baseName_local;
  char *name_local;
  
  charmap = (Charmap *)0x0;
  base = (Charmap *)baseName;
  baseName_local = name;
  if ((baseName != (char *)0x0) && (charmap = charmap_Get(baseName), charmap == (Charmap *)0x0)) {
    error("Base charmap \'%s\' doesn\'t exist\n",base);
  }
  local_30 = charmap_Get(baseName_local);
  if (local_30 == (Charmap *)0x0) {
    if (charmap == (Charmap *)0x0) {
      resizeCharmap(&local_30,0x20);
      local_30->usedNodes = 1;
      initNode((Charnode *)(local_30 + 1));
    }
    else {
      resizeCharmap(&local_30,charmap->capacity);
      local_30->usedNodes = charmap->usedNodes;
      memcpy(local_30 + 1,charmap + 1,local_30->usedNodes << 0xb);
    }
    pcVar1 = strdup(baseName_local);
    local_30->name = pcVar1;
    currentCharmap = (Charmap **)hash_AddElement(charmaps,local_30->name,local_30);
    name_local = (char *)local_30;
  }
  else {
    error("Charmap \'%s\' already exists\n",baseName_local);
    name_local = (char *)local_30;
  }
  return (Charmap *)name_local;
}

Assistant:

struct Charmap *charmap_New(char const *name, char const *baseName)
{
	struct Charmap *base = NULL;

	if (baseName != NULL) {
		base = charmap_Get(baseName);

		if (base == NULL)
			error("Base charmap '%s' doesn't exist\n", baseName);
	}

	struct Charmap *charmap = charmap_Get(name);

	if (charmap) {
		error("Charmap '%s' already exists\n", name);
		return charmap;
	}

	// Init the new charmap's fields
	if (base) {
		resizeCharmap(&charmap, base->capacity);
		charmap->usedNodes = base->usedNodes;

		memcpy(charmap->nodes, base->nodes, sizeof(base->nodes[0]) * charmap->usedNodes);
	} else {
		resizeCharmap(&charmap, INITIAL_CAPACITY);
		charmap->usedNodes = 1;
		initNode(&charmap->nodes[0]); // Init the root node
	}
	charmap->name = strdup(name);

	currentCharmap = (struct Charmap **)hash_AddElement(charmaps, charmap->name, charmap);

	return charmap;
}